

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void __thiscall
TestMaterial::initializeUniverse
          (TestMaterial *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenameList)

{
  bool bVar1;
  long lVar2;
  S_Polyhedron *this_00;
  STP_BV *this_01;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  string filename;
  string extension;
  string local_50 [32];
  
  uVar3 = 0;
  while( true ) {
    if ((ulong)(*(long *)(filenameList + 8) - *(long *)filenameList >> 5) <= (ulong)uVar3) break;
    std::__cxx11::string::string
              ((string *)&filename,(string *)(*(long *)filenameList + (ulong)uVar3 * 0x20));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extension,"",(allocator<char> *)local_50);
    lVar2 = std::__cxx11::string::find_last_of((char *)&filename,0x106276);
    if (lVar2 != -1) {
      std::__cxx11::string::find_last_of((char *)&filename,0x106276);
      std::__cxx11::string::substr((ulong)local_50,(ulong)&filename);
      std::__cxx11::string::operator=((string *)&extension,local_50);
      std::__cxx11::string::~string(local_50);
    }
    bVar1 = std::operator==(&extension,"otp");
    if (bVar1) {
      this_00 = (S_Polyhedron *)operator_new(0xf0);
      sch::S_Polyhedron::S_Polyhedron(this_00);
      (**(code **)(*(long *)this_00 + 0x30))(this_00,&filename);
      sch::CD_Scene::addObject((S_Object *)this);
    }
    else {
      this_01 = (STP_BV *)operator_new(0xe8);
      sch::STP_BV::STP_BV(this_01);
      (**(code **)(*(long *)this_01 + 0x48))(this_01,&filename);
      sch::CD_Scene::addObject((S_Object *)this);
    }
    std::__cxx11::string::~string((string *)&extension);
    std::__cxx11::string::~string((string *)&filename);
    uVar3 = uVar3 + 1;
  }
  lVar2 = -2;
  lVar4 = -3;
  uVar6 = 0;
  uVar5 = 0;
  uVar7 = 0;
  while( true ) {
    if ((ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3) <= uVar7) break;
    filename._M_dataplus._M_p = (pointer)((double)(long)(lVar2 + (uVar5 / 5) * -5) * 0.2);
    filename._M_string_length =
         (size_type)((double)(long)(lVar4 + (uVar6 / 6) * -6) * 0.8333333333333334 * 0.2);
    filename.field_2._M_allocated_capacity =
         (size_type)((double)(long)(lVar4 + (uVar6 / 7) * -7) * 0.7142857142857143 * 0.2);
    sch::S_Object::setPosition(*(Vector3T **)(*(long *)&this->field_0x8 + uVar7 * 8));
    uVar7 = uVar7 + 1;
    lVar2 = lVar2 + 7;
    uVar5 = uVar5 + 7;
    lVar4 = lVar4 + 5;
    uVar6 = uVar6 + 5;
  }
  sch::CD_Scene::sceneProximityQuery();
  return;
}

Assistant:

void TestMaterial::initializeUniverse(const std::vector<std::string> & filenameList)
{
  for(unsigned i=0; i<filenameList.size(); ++i)
  {
    std::string filename = filenameList[i];
    std::string extension = "";
    if(filename.find_last_of(".") != std::string::npos)
    {
      extension = filename.substr(filename.find_last_of(".")+1);
    }
    if(extension == "otp")
    {
      S_Polyhedron* s = new S_Polyhedron();
      s->constructFromFile(filename);
      sObj.addObject(s);
    }
    else //if(extension == "txt")
    {
      STP_BV* s = new STP_BV();
      s->constructFromFileWithGL(filename);
      sObj.addObject(s);
    }
  }

  for (size_t i=0; i<sObj.size(); i++)
  {
    Vector3 position(
      Scalar(7*i%5)-2.,
      (Scalar(5*i%6)-3.)*(5.0/6.),
      (Scalar(5*i%7)-3.)*(5.0/7.)
    );
    position *= DispersionScale;
    sObj[i]->setPosition(position);
  }

  DoTest();
}